

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_drag_behavior(nk_flags *state,nk_input *in,nk_rect drag,nk_property_variant *variant,
                     float inc_per_pixel)

{
  nk_property_kind nVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  float fVar5;
  nk_property local_80;
  nk_property local_78;
  double local_70;
  int local_64;
  int local_60;
  float local_5c;
  int local_58;
  int local_54;
  int local_50;
  float pixels;
  float delta;
  int left_mouse_click_in_cursor;
  int left_mouse_down;
  float inc_per_pixel_local;
  nk_property_variant *variant_local;
  nk_input *in_local;
  nk_flags *state_local;
  nk_rect drag_local;
  
  bVar3 = false;
  if (in != (nk_input *)0x0) {
    bVar3 = (in->mouse).buttons[0].down != 0;
  }
  bVar4 = false;
  if (in != (nk_input *)0x0) {
    iVar2 = nk_input_has_mouse_click_down_in_rect(in,NK_BUTTON_LEFT,drag,1);
    bVar4 = iVar2 != 0;
  }
  if ((*state & 2) == 0) {
    *state = 4;
  }
  else {
    *state = 6;
  }
  iVar2 = nk_input_is_mouse_hovering_rect(in,drag);
  if (iVar2 != 0) {
    *state = 0x12;
  }
  if ((bVar3) && (bVar4)) {
    fVar5 = (in->mouse).delta.x * inc_per_pixel;
    nVar1 = variant->kind;
    if (nVar1 == NK_PROPERTY_INT) {
      (variant->value).i = (variant->value).i + (int)fVar5;
      if ((variant->value).i < (variant->max_value).i) {
        local_50 = (variant->value).i;
      }
      else {
        local_50 = (variant->max_value).i;
      }
      if (local_50 < (variant->min_value).i) {
        local_54 = (variant->min_value).i;
      }
      else {
        if ((variant->value).i < (variant->max_value).i) {
          local_58 = (variant->value).i;
        }
        else {
          local_58 = (variant->max_value).i;
        }
        local_54 = local_58;
      }
      (variant->value).i = local_54;
    }
    else if (nVar1 == NK_PROPERTY_FLOAT) {
      (variant->value).f = (variant->value).f + fVar5;
      if ((variant->max_value).f <= (variant->value).f) {
        local_5c = (variant->max_value).f;
      }
      else {
        local_5c = (variant->value).f;
      }
      if ((variant->min_value).f <= local_5c) {
        if ((variant->max_value).f <= (variant->value).f) {
          local_64 = (variant->max_value).i;
        }
        else {
          local_64 = (variant->value).i;
        }
        local_60 = local_64;
      }
      else {
        local_60 = (variant->min_value).i;
      }
      (variant->value).i = local_60;
    }
    else if (nVar1 == NK_PROPERTY_DOUBLE) {
      (variant->value).d = (variant->value).d + (double)fVar5;
      if ((variant->max_value).d <= (variant->value).d) {
        local_70 = (variant->max_value).d;
      }
      else {
        local_70 = (variant->value).d;
      }
      if ((variant->min_value).d <= local_70) {
        if ((variant->max_value).d <= (variant->value).d) {
          local_80 = variant->max_value;
        }
        else {
          local_80 = variant->value;
        }
        local_78 = local_80;
      }
      else {
        local_78 = variant->min_value;
      }
      variant->value = local_78;
    }
    *state = 0x22;
  }
  if (((*state & 0x10) == 0) || (iVar2 = nk_input_is_mouse_prev_hovering_rect(in,drag), iVar2 != 0))
  {
    iVar2 = nk_input_is_mouse_prev_hovering_rect(in,drag);
    if (iVar2 != 0) {
      *state = *state | 0x40;
    }
  }
  else {
    *state = *state | 8;
  }
  return;
}

Assistant:

NK_LIB void
nk_drag_behavior(nk_flags *state, const struct nk_input *in,
    struct nk_rect drag, struct nk_property_variant *variant,
    float inc_per_pixel)
{
    int left_mouse_down = in && in->mouse.buttons[NK_BUTTON_LEFT].down;
    int left_mouse_click_in_cursor = in &&
        nk_input_has_mouse_click_down_in_rect(in, NK_BUTTON_LEFT, drag, nk_true);

    nk_widget_state_reset(state);
    if (nk_input_is_mouse_hovering_rect(in, drag))
        *state = NK_WIDGET_STATE_HOVERED;

    if (left_mouse_down && left_mouse_click_in_cursor) {
        float delta, pixels;
        pixels = in->mouse.delta.x;
        delta = pixels * inc_per_pixel;
        switch (variant->kind) {
        default: break;
        case NK_PROPERTY_INT:
            variant->value.i = variant->value.i + (int)delta;
            variant->value.i = NK_CLAMP(variant->min_value.i, variant->value.i, variant->max_value.i);
            break;
        case NK_PROPERTY_FLOAT:
            variant->value.f = variant->value.f + (float)delta;
            variant->value.f = NK_CLAMP(variant->min_value.f, variant->value.f, variant->max_value.f);
            break;
        case NK_PROPERTY_DOUBLE:
            variant->value.d = variant->value.d + (double)delta;
            variant->value.d = NK_CLAMP(variant->min_value.d, variant->value.d, variant->max_value.d);
            break;
        }
        *state = NK_WIDGET_STATE_ACTIVE;
    }
    if (*state & NK_WIDGET_STATE_HOVER && !nk_input_is_mouse_prev_hovering_rect(in, drag))
        *state |= NK_WIDGET_STATE_ENTERED;
    else if (nk_input_is_mouse_prev_hovering_rect(in, drag))
        *state |= NK_WIDGET_STATE_LEFT;
}